

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGen_X86.h
# Opt level: O0

void __thiscall CodeGenGenericContext::CodeGenGenericContext(CodeGenGenericContext *this)

{
  MemCache *local_50;
  x86Argument *local_38;
  x86Argument *local_18;
  CodeGenGenericContext *this_local;
  
  local_18 = this->genReg;
  do {
    x86Argument::x86Argument(local_18);
    local_18 = local_18 + 1;
  } while (local_18 != (x86Argument *)this->genRegUpdate);
  local_38 = this->xmmReg;
  do {
    x86Argument::x86Argument(local_38);
    local_38 = local_38 + 1;
  } while (local_38 != (x86Argument *)this->xmmRegUpdate);
  local_50 = this->memCache;
  do {
    MemCache::MemCache(local_50);
    local_50 = local_50 + 1;
  } while (local_50 != (MemCache *)&this->memCacheNextSlot);
  this->x86Op = (x86Instruction *)0x0;
  this->x86Base = (x86Instruction *)0x0;
  this->x86LookBehind = true;
  this->lastInvalidate = 0;
  memset(this->genReg,0,0x220);
  memset(this->genRegUpdate,0,0x44);
  memset(this->genRegRead,0,0x11);
  memset(this->xmmReg,0,0x200);
  memset(this->xmmRegUpdate,0,0x40);
  memset(this->xmmRegRead,0,0x10);
  memset(this->memCache,0,0x480);
  this->memCacheNextSlot = 0;
  this->memCacheFreeSlotCount = 0;
  memset(this->memCacheFreeSlots,0,0x40);
  this->optimizationCount = 0;
  this->currFreeReg = 0;
  this->lockedRegA = rRegCount;
  this->lockedRegB = rRegCount;
  this->currFreeXmmReg = rXMM0;
  this->lockedXmmRegA = rXmmRegCount;
  this->lockedXmmRegB = rXmmRegCount;
  this->skipTracking = false;
  return;
}

Assistant:

CodeGenGenericContext()
	{
		x86Op = NULL;
		x86Base = NULL;

		x86LookBehind = true;

		lastInvalidate = 0;

		memset(genReg, 0, rRegCount * sizeof(x86Argument));
		memset(genRegUpdate, 0, rRegCount * sizeof(unsigned));
		memset(genRegRead, 0, rRegCount * sizeof(bool));

		memset(xmmReg, 0, rXmmRegCount * sizeof(x86Argument));
		memset(xmmRegUpdate, 0, rXmmRegCount * sizeof(unsigned));
		memset(xmmRegRead, 0, rXmmRegCount * sizeof(bool));

		memset(memCache, 0, memoryStateSize * sizeof(MemCache));

		memCacheNextSlot = 0;
		memCacheFreeSlotCount = 0;

		memset(memCacheFreeSlots, 0, memoryStateSize * sizeof(unsigned));

		optimizationCount = 0;

		currFreeReg = 0;
		lockedRegA = rRegCount;
		lockedRegB = rRegCount;

		currFreeXmmReg = rXMM0;
		lockedXmmRegA = rXmmRegCount;
		lockedXmmRegB = rXmmRegCount;

		skipTracking = false;
	}